

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  undefined8 uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar15;
  byte bVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined1 (*pauVar20) [16];
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar30;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  float fVar33;
  uint uVar34;
  float fVar44;
  float fVar46;
  vint4 bi;
  uint uVar45;
  uint uVar47;
  float fVar48;
  uint uVar49;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar43;
  int iVar50;
  int iVar55;
  int iVar56;
  vint4 bi_1;
  int iVar57;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar58;
  float fVar65;
  float fVar67;
  vint4 ai;
  uint uVar59;
  uint uVar66;
  uint uVar68;
  float fVar69;
  uint uVar70;
  undefined1 auVar60 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar74;
  float fVar75;
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar71;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar79;
  float fVar82;
  float fVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar84;
  float fVar85;
  float fVar91;
  float fVar92;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar90;
  float fVar93;
  float fVar94;
  float fVar98;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  int iVar129;
  float fVar130;
  int iVar131;
  float fVar132;
  int iVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined8 local_1208;
  vbool<4> valid;
  undefined1 local_11b8 [16];
  long local_11a0;
  long local_1198;
  ulong local_1190;
  Scene *local_1188;
  undefined1 (*local_1180) [16];
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_10e8 [4];
  float local_10d8 [4];
  float local_10c8 [4];
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 local_10a8 [16];
  float local_1098 [4];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar21;
  undefined1 auVar97 [16];
  
  pSVar30 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar84 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar106 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar94 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar93 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar108 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar25 = uVar28 ^ 0x10;
  iVar17 = (tray->tnear).field_0.i[k];
  iVar50 = (tray->tfar).field_0.i[k];
  pauVar20 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1018 = fVar84;
  fStack_1014 = fVar84;
  fStack_1010 = fVar84;
  fStack_100c = fVar84;
  local_1028 = fVar106;
  fStack_1024 = fVar106;
  fStack_1020 = fVar106;
  fStack_101c = fVar106;
  local_1038 = fVar94;
  fStack_1034 = fVar94;
  fStack_1030 = fVar94;
  fStack_102c = fVar94;
  local_1048 = fVar98;
  fStack_1044 = fVar98;
  fStack_1040 = fVar98;
  fStack_103c = fVar98;
  local_1058 = fVar93;
  fStack_1054 = fVar93;
  fStack_1050 = fVar93;
  fStack_104c = fVar93;
  local_1068 = fVar108;
  fStack_1064 = fVar108;
  fStack_1060 = fVar108;
  fStack_105c = fVar108;
  local_1078 = iVar17;
  iStack_1074 = iVar17;
  iStack_1070 = iVar17;
  iStack_106c = iVar17;
  fVar110 = fVar84;
  fVar112 = fVar84;
  fVar114 = fVar84;
  fVar100 = fVar106;
  fVar101 = fVar106;
  fVar102 = fVar106;
  fVar74 = fVar94;
  fVar76 = fVar94;
  fVar78 = fVar94;
  fVar115 = fVar98;
  fVar116 = fVar98;
  fVar117 = fVar98;
  fVar119 = fVar93;
  fVar121 = fVar93;
  fVar123 = fVar93;
  fVar125 = fVar108;
  fVar126 = fVar108;
  fVar127 = fVar108;
  iVar129 = iVar17;
  iVar131 = iVar17;
  iVar133 = iVar17;
  iVar55 = iVar50;
  iVar56 = iVar50;
  iVar57 = iVar50;
  local_1180 = pauVar20;
LAB_006e4bc3:
  do {
    do {
      if (pSVar30 == stack) {
        return;
      }
      pSVar15 = pSVar30 + -1;
      pSVar30 = pSVar30 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar15->dist &&
             (float)pSVar15->dist != *(float *)(ray + k * 4 + 0x80));
    pauVar31 = (undefined1 (*) [16])(pSVar30->ptr).ptr;
    while (((ulong)pauVar31 & 8) == 0) {
      pfVar4 = (float *)(pauVar31[2] + uVar28);
      fVar33 = (*pfVar4 - fVar84) * fVar98;
      fVar44 = (pfVar4[1] - fVar110) * fVar115;
      fVar46 = (pfVar4[2] - fVar112) * fVar116;
      fVar48 = (pfVar4[3] - fVar114) * fVar117;
      pfVar4 = (float *)(pauVar31[2] + uVar29);
      fVar58 = (*pfVar4 - fVar106) * fVar93;
      fVar65 = (pfVar4[1] - fVar100) * fVar119;
      fVar67 = (pfVar4[2] - fVar101) * fVar121;
      fVar69 = (pfVar4[3] - fVar102) * fVar123;
      uVar59 = (uint)((int)fVar58 < (int)fVar33) * (int)fVar33 |
               (uint)((int)fVar58 >= (int)fVar33) * (int)fVar58;
      uVar66 = (uint)((int)fVar65 < (int)fVar44) * (int)fVar44 |
               (uint)((int)fVar65 >= (int)fVar44) * (int)fVar65;
      uVar68 = (uint)((int)fVar67 < (int)fVar46) * (int)fVar46 |
               (uint)((int)fVar67 >= (int)fVar46) * (int)fVar67;
      uVar70 = (uint)((int)fVar69 < (int)fVar48) * (int)fVar48 |
               (uint)((int)fVar69 >= (int)fVar48) * (int)fVar69;
      pfVar4 = (float *)(pauVar31[2] + uVar24);
      fVar33 = (*pfVar4 - fVar94) * fVar108;
      fVar44 = (pfVar4[1] - fVar74) * fVar125;
      fVar46 = (pfVar4[2] - fVar76) * fVar126;
      fVar48 = (pfVar4[3] - fVar78) * fVar127;
      uVar34 = (uint)((int)fVar33 < iVar17) * iVar17 | (uint)((int)fVar33 >= iVar17) * (int)fVar33;
      uVar45 = (uint)((int)fVar44 < iVar129) * iVar129 |
               (uint)((int)fVar44 >= iVar129) * (int)fVar44;
      uVar47 = (uint)((int)fVar46 < iVar131) * iVar131 |
               (uint)((int)fVar46 >= iVar131) * (int)fVar46;
      uVar49 = (uint)((int)fVar48 < iVar133) * iVar133 |
               (uint)((int)fVar48 >= iVar133) * (int)fVar48;
      tNear.field_0.i[0] =
           ((int)uVar34 < (int)uVar59) * uVar59 | ((int)uVar34 >= (int)uVar59) * uVar34;
      tNear.field_0.i[1] =
           ((int)uVar45 < (int)uVar66) * uVar66 | ((int)uVar45 >= (int)uVar66) * uVar45;
      tNear.field_0.i[2] =
           ((int)uVar47 < (int)uVar68) * uVar68 | ((int)uVar47 >= (int)uVar68) * uVar47;
      tNear.field_0.i[3] =
           ((int)uVar49 < (int)uVar70) * uVar70 | ((int)uVar49 >= (int)uVar70) * uVar49;
      pfVar4 = (float *)(pauVar31[2] + uVar25);
      fVar33 = (*pfVar4 - fVar84) * fVar98;
      fVar44 = (pfVar4[1] - fVar110) * fVar115;
      fVar46 = (pfVar4[2] - fVar112) * fVar116;
      fVar48 = (pfVar4[3] - fVar114) * fVar117;
      pfVar4 = (float *)(pauVar31[2] + (uVar29 ^ 0x10));
      fVar58 = (*pfVar4 - fVar106) * fVar93;
      fVar65 = (pfVar4[1] - fVar100) * fVar119;
      fVar67 = (pfVar4[2] - fVar101) * fVar121;
      fVar69 = (pfVar4[3] - fVar102) * fVar123;
      uVar59 = (uint)((int)fVar33 < (int)fVar58) * (int)fVar33 |
               (uint)((int)fVar33 >= (int)fVar58) * (int)fVar58;
      uVar66 = (uint)((int)fVar44 < (int)fVar65) * (int)fVar44 |
               (uint)((int)fVar44 >= (int)fVar65) * (int)fVar65;
      uVar68 = (uint)((int)fVar46 < (int)fVar67) * (int)fVar46 |
               (uint)((int)fVar46 >= (int)fVar67) * (int)fVar67;
      uVar70 = (uint)((int)fVar48 < (int)fVar69) * (int)fVar48 |
               (uint)((int)fVar48 >= (int)fVar69) * (int)fVar69;
      pfVar4 = (float *)(pauVar31[2] + (uVar24 ^ 0x10));
      fVar33 = (*pfVar4 - fVar94) * fVar108;
      fVar44 = (pfVar4[1] - fVar74) * fVar125;
      fVar46 = (pfVar4[2] - fVar76) * fVar126;
      fVar48 = (pfVar4[3] - fVar78) * fVar127;
      uVar34 = (uint)(iVar50 < (int)fVar33) * iVar50 | (uint)(iVar50 >= (int)fVar33) * (int)fVar33;
      uVar45 = (uint)(iVar55 < (int)fVar44) * iVar55 | (uint)(iVar55 >= (int)fVar44) * (int)fVar44;
      uVar47 = (uint)(iVar56 < (int)fVar46) * iVar56 | (uint)(iVar56 >= (int)fVar46) * (int)fVar46;
      uVar49 = (uint)(iVar57 < (int)fVar48) * iVar57 | (uint)(iVar57 >= (int)fVar48) * (int)fVar48;
      auVar60._0_4_ =
           -(uint)((int)(((int)uVar59 < (int)uVar34) * uVar59 |
                        ((int)uVar59 >= (int)uVar34) * uVar34) < tNear.field_0.i[0]);
      auVar60._4_4_ =
           -(uint)((int)(((int)uVar66 < (int)uVar45) * uVar66 |
                        ((int)uVar66 >= (int)uVar45) * uVar45) < tNear.field_0.i[1]);
      auVar60._8_4_ =
           -(uint)((int)(((int)uVar68 < (int)uVar47) * uVar68 |
                        ((int)uVar68 >= (int)uVar47) * uVar47) < tNear.field_0.i[2]);
      auVar60._12_4_ =
           -(uint)((int)(((int)uVar70 < (int)uVar49) * uVar70 |
                        ((int)uVar70 >= (int)uVar49) * uVar49) < tNear.field_0.i[3]);
      uVar34 = movmskps((int)pauVar20,auVar60);
      pauVar20 = (undefined1 (*) [16])(ulong)uVar34;
      if (uVar34 == 0xf) goto LAB_006e4bc3;
      bVar16 = (byte)uVar34 ^ 0xf;
      uVar32 = (ulong)pauVar31 & 0xfffffffffffffff0;
      lVar26 = 0;
      if (bVar16 != 0) {
        for (; (bVar16 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
        }
      }
      pauVar20 = *(undefined1 (**) [16])(uVar32 + lVar26 * 8);
      uVar34 = bVar16 - 1 & (uint)bVar16;
      pauVar31 = pauVar20;
      if (uVar34 != 0) {
        uVar45 = tNear.field_0.i[lVar26];
        lVar26 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
          }
        }
        pauVar31 = *(undefined1 (**) [16])(uVar32 + lVar26 * 8);
        uVar47 = tNear.field_0.i[lVar26];
        uVar34 = uVar34 - 1 & uVar34;
        if (uVar34 == 0) {
          if (uVar45 < uVar47) {
            (pSVar30->ptr).ptr = (size_t)pauVar31;
            pSVar30->dist = uVar47;
            pSVar30 = pSVar30 + 1;
            pauVar31 = pauVar20;
          }
          else {
            (pSVar30->ptr).ptr = (size_t)pauVar20;
            pSVar30->dist = uVar45;
            pauVar20 = pauVar31;
            pSVar30 = pSVar30 + 1;
          }
        }
        else {
          auVar81._8_4_ = uVar45;
          auVar81._0_8_ = pauVar20;
          auVar81._12_4_ = 0;
          auVar88._8_4_ = uVar47;
          auVar88._0_8_ = pauVar31;
          auVar88._12_4_ = 0;
          lVar26 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
            }
          }
          uVar6 = *(undefined8 *)(uVar32 + lVar26 * 8);
          iVar5 = tNear.field_0.i[lVar26];
          auVar96._8_4_ = iVar5;
          auVar96._0_8_ = uVar6;
          auVar96._12_4_ = 0;
          auVar89._8_4_ = -(uint)((int)uVar45 < (int)uVar47);
          uVar34 = uVar34 - 1 & uVar34;
          if (uVar34 == 0) {
            auVar89._4_4_ = auVar89._8_4_;
            auVar89._0_4_ = auVar89._8_4_;
            auVar89._12_4_ = auVar89._8_4_;
            auVar86._8_4_ = uVar47;
            auVar86._0_8_ = pauVar31;
            auVar86._12_4_ = 0;
            auVar87 = blendvps(auVar86,auVar81,auVar89);
            auVar60 = blendvps(auVar81,auVar88,auVar89);
            auVar35._8_4_ = -(uint)(auVar87._8_4_ < iVar5);
            auVar35._4_4_ = auVar35._8_4_;
            auVar35._0_4_ = auVar35._8_4_;
            auVar35._12_4_ = auVar35._8_4_;
            auVar80._8_4_ = iVar5;
            auVar80._0_8_ = uVar6;
            auVar80._12_4_ = 0;
            auVar81 = blendvps(auVar80,auVar87,auVar35);
            auVar88 = blendvps(auVar87,auVar96,auVar35);
            auVar36._8_4_ = -(uint)(auVar60._8_4_ < auVar88._8_4_);
            auVar36._4_4_ = auVar36._8_4_;
            auVar36._0_4_ = auVar36._8_4_;
            auVar36._12_4_ = auVar36._8_4_;
            SVar71 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar88,auVar60,auVar36);
            SVar61 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar60,auVar88,auVar36);
            *pSVar30 = SVar61;
            pSVar30[1] = SVar71;
            pauVar20 = auVar81._0_8_;
            pSVar30 = pSVar30 + 2;
            pauVar31 = pauVar20;
          }
          else {
            lVar26 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
              }
            }
            auVar87._4_4_ = auVar89._8_4_;
            auVar87._0_4_ = auVar89._8_4_;
            auVar87._8_4_ = auVar89._8_4_;
            auVar87._12_4_ = auVar89._8_4_;
            auVar89 = blendvps(auVar88,auVar81,auVar87);
            auVar60 = blendvps(auVar81,auVar88,auVar87);
            auVar95._8_4_ = tNear.field_0.i[lVar26];
            auVar95._0_8_ = *(undefined8 *)(uVar32 + lVar26 * 8);
            auVar95._12_4_ = 0;
            auVar37._8_4_ = -(uint)(iVar5 < tNear.field_0.i[lVar26]);
            auVar37._4_4_ = auVar37._8_4_;
            auVar37._0_4_ = auVar37._8_4_;
            auVar37._12_4_ = auVar37._8_4_;
            auVar88 = blendvps(auVar95,auVar96,auVar37);
            auVar81 = blendvps(auVar96,auVar95,auVar37);
            auVar38._8_4_ = -(uint)(auVar60._8_4_ < auVar81._8_4_);
            auVar38._4_4_ = auVar38._8_4_;
            auVar38._0_4_ = auVar38._8_4_;
            auVar38._12_4_ = auVar38._8_4_;
            auVar96 = blendvps(auVar81,auVar60,auVar38);
            SVar61 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar60,auVar81,auVar38);
            auVar39._8_4_ = -(uint)(auVar89._8_4_ < auVar88._8_4_);
            auVar39._4_4_ = auVar39._8_4_;
            auVar39._0_4_ = auVar39._8_4_;
            auVar39._12_4_ = auVar39._8_4_;
            auVar60 = blendvps(auVar88,auVar89,auVar39);
            auVar81 = blendvps(auVar89,auVar88,auVar39);
            auVar40._8_4_ = -(uint)(auVar81._8_4_ < auVar96._8_4_);
            auVar40._4_4_ = auVar40._8_4_;
            auVar40._0_4_ = auVar40._8_4_;
            auVar40._12_4_ = auVar40._8_4_;
            SVar71 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar96,auVar81,auVar40);
            SVar90 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar81,auVar96,auVar40);
            *pSVar30 = SVar61;
            pSVar30[1] = SVar90;
            pSVar30[2] = SVar71;
            pauVar20 = auVar60._0_8_;
            pSVar30 = pSVar30 + 3;
            pauVar31 = pauVar20;
          }
        }
      }
    }
    lVar26 = (ulong)((uint)pauVar31 & 0xf) - 8;
    uVar32 = (ulong)pauVar31 & 0xfffffffffffffff0;
    for (lVar27 = 0; lVar27 != lVar26; lVar27 = lVar27 + 1) {
      lVar23 = lVar27 * 0xb0;
      pfVar4 = (float *)(uVar32 + 0x80 + lVar23);
      fVar110 = *pfVar4;
      fVar112 = pfVar4[1];
      fVar114 = pfVar4[2];
      fVar100 = pfVar4[3];
      pfVar4 = (float *)(uVar32 + 0x40 + lVar23);
      fVar101 = *pfVar4;
      fVar102 = pfVar4[1];
      fVar74 = pfVar4[2];
      fVar76 = pfVar4[3];
      pfVar4 = (float *)(uVar32 + 0x70 + lVar23);
      fVar78 = *pfVar4;
      fVar115 = pfVar4[1];
      fVar116 = pfVar4[2];
      fVar117 = pfVar4[3];
      pfVar4 = (float *)(uVar32 + 0x50 + lVar23);
      fVar119 = *pfVar4;
      fVar121 = pfVar4[1];
      fVar123 = pfVar4[2];
      fVar125 = pfVar4[3];
      fVar67 = fVar78 * fVar119 - fVar110 * fVar101;
      fVar69 = fVar115 * fVar121 - fVar112 * fVar102;
      fVar75 = fVar116 * fVar123 - fVar114 * fVar74;
      fVar77 = fVar117 * fVar125 - fVar100 * fVar76;
      pfVar4 = (float *)(uVar32 + 0x60 + lVar23);
      fVar126 = *pfVar4;
      fVar127 = pfVar4[1];
      fVar33 = pfVar4[2];
      fVar44 = pfVar4[3];
      pfVar4 = (float *)(uVar32 + lVar23);
      pfVar1 = (float *)(uVar32 + 0x10 + lVar23);
      pfVar2 = (float *)(uVar32 + 0x20 + lVar23);
      pfVar3 = (float *)(uVar32 + 0x30 + lVar23);
      fVar46 = *pfVar3;
      fVar48 = pfVar3[1];
      fVar58 = pfVar3[2];
      fVar65 = pfVar3[3];
      local_10a8._0_4_ = fVar110 * fVar46 - fVar119 * fVar126;
      local_10a8._4_4_ = fVar112 * fVar48 - fVar121 * fVar127;
      local_10a8._8_4_ = fVar114 * fVar58 - fVar123 * fVar33;
      local_10a8._12_4_ = fVar100 * fVar65 - fVar125 * fVar44;
      fVar84 = *(float *)(ray + k * 4);
      fVar106 = *(float *)(ray + k * 4 + 0x20);
      fVar94 = *(float *)(ray + k * 4 + 0x40);
      fVar79 = *pfVar4 - fVar84;
      fVar82 = pfVar4[1] - fVar84;
      fVar83 = pfVar4[2] - fVar84;
      fVar84 = pfVar4[3] - fVar84;
      fVar103 = *pfVar2 - fVar106;
      fVar104 = pfVar2[1] - fVar106;
      fVar105 = pfVar2[2] - fVar106;
      fVar106 = pfVar2[3] - fVar106;
      fVar98 = *(float *)(ray + k * 4 + 0x60);
      fVar128 = fVar94 * fVar103 - fVar79 * fVar98;
      fVar130 = fVar94 * fVar104 - fVar82 * fVar98;
      fVar132 = fVar94 * fVar105 - fVar83 * fVar98;
      fVar134 = fVar94 * fVar106 - fVar84 * fVar98;
      local_1098[0] = fVar101 * fVar126 - fVar78 * fVar46;
      local_1098[1] = fVar102 * fVar127 - fVar115 * fVar48;
      local_1098[2] = fVar74 * fVar33 - fVar116 * fVar58;
      local_1098[3] = fVar76 * fVar44 - fVar117 * fVar65;
      fVar93 = *(float *)(ray + k * 4 + 0x10);
      fVar85 = *pfVar1 - fVar93;
      fVar91 = pfVar1[1] - fVar93;
      fVar92 = pfVar1[2] - fVar93;
      fVar93 = pfVar1[3] - fVar93;
      fVar108 = *(float *)(ray + k * 4 + 0x50);
      fVar107 = fVar98 * fVar85 - fVar108 * fVar103;
      fVar109 = fVar98 * fVar91 - fVar108 * fVar104;
      fVar111 = fVar98 * fVar92 - fVar108 * fVar105;
      fVar113 = fVar98 * fVar93 - fVar108 * fVar106;
      local_1208 = CONCAT44(fVar69,fVar67);
      fVar135 = fVar108 * fVar79 - fVar94 * fVar85;
      fVar136 = fVar108 * fVar82 - fVar94 * fVar91;
      fVar137 = fVar108 * fVar83 - fVar94 * fVar92;
      fVar138 = fVar108 * fVar84 - fVar94 * fVar93;
      fVar118 = fVar98 * local_1098[0] + local_10a8._0_4_ * fVar108 + fVar67 * fVar94;
      fVar120 = fVar98 * local_1098[1] + local_10a8._4_4_ * fVar108 + fVar69 * fVar94;
      fVar122 = fVar98 * local_1098[2] + local_10a8._8_4_ * fVar108 + fVar75 * fVar94;
      fVar124 = fVar98 * local_1098[3] + local_10a8._12_4_ * fVar108 + fVar77 * fVar94;
      uVar45 = (uint)fVar118 & 0x80000000;
      uVar47 = (uint)fVar120 & 0x80000000;
      uVar49 = (uint)fVar122 & 0x80000000;
      uVar59 = (uint)fVar124 & 0x80000000;
      tNear.field_0.i[0] = (uint)(fVar126 * fVar107 + fVar78 * fVar128 + fVar110 * fVar135) ^ uVar45
      ;
      tNear.field_0.i[1] =
           (uint)(fVar127 * fVar109 + fVar115 * fVar130 + fVar112 * fVar136) ^ uVar47;
      tNear.field_0.i[2] = (uint)(fVar33 * fVar111 + fVar116 * fVar132 + fVar114 * fVar137) ^ uVar49
      ;
      tNear.field_0.i[3] = (uint)(fVar44 * fVar113 + fVar117 * fVar134 + fVar100 * fVar138) ^ uVar59
      ;
      fVar108 = (float)((uint)(fVar107 * fVar46 + fVar128 * fVar101 + fVar135 * fVar119) ^ uVar45);
      fVar110 = (float)((uint)(fVar109 * fVar48 + fVar130 * fVar102 + fVar136 * fVar121) ^ uVar47);
      fVar112 = (float)((uint)(fVar111 * fVar58 + fVar132 * fVar74 + fVar137 * fVar123) ^ uVar49);
      fVar114 = (float)((uint)(fVar113 * fVar65 + fVar134 * fVar76 + fVar138 * fVar125) ^ uVar59);
      fVar94 = ABS(fVar118);
      fVar98 = ABS(fVar120);
      auVar97._0_8_ = CONCAT44(fVar120,fVar118) & 0x7fffffff7fffffff;
      auVar97._8_4_ = ABS(fVar122);
      auVar97._12_4_ = ABS(fVar124);
      bVar13 = tNear.field_0.v[0] + fVar108 <= fVar94 &&
               ((0.0 <= fVar108 && 0.0 <= tNear.field_0.v[0]) && fVar118 != 0.0);
      auVar99._0_4_ = -(uint)bVar13;
      bVar14 = tNear.field_0.v[1] + fVar110 <= fVar98 &&
               ((0.0 <= fVar110 && 0.0 <= tNear.field_0.v[1]) && fVar120 != 0.0);
      auVar99._4_4_ = -(uint)bVar14;
      bVar12 = tNear.field_0.v[2] + fVar112 <= auVar97._8_4_ &&
               ((0.0 <= fVar112 && 0.0 <= tNear.field_0.v[2]) && fVar122 != 0.0);
      auVar99._8_4_ = -(uint)bVar12;
      bVar11 = tNear.field_0.v[3] + fVar114 <= auVar97._12_4_ &&
               ((0.0 <= fVar114 && 0.0 <= tNear.field_0.v[3]) && fVar124 != 0.0);
      auVar99._12_4_ = -(uint)bVar11;
      uVar34 = movmskps((int)pauVar20,auVar99);
      pauVar20 = (undefined1 (*) [16])(ulong)uVar34;
      if (uVar34 != 0) {
        fVar100 = (float)(uVar45 ^ (uint)(fVar79 * fVar67 +
                                         fVar85 * local_10a8._0_4_ + fVar103 * local_1098[0]));
        fVar101 = (float)(uVar47 ^ (uint)(fVar82 * fVar69 +
                                         fVar91 * local_10a8._4_4_ + fVar104 * local_1098[1]));
        fVar102 = (float)(uVar49 ^ (uint)(fVar83 * fVar75 +
                                         fVar92 * local_10a8._8_4_ + fVar105 * local_1098[2]));
        fVar93 = (float)(uVar59 ^ (uint)(fVar84 * fVar77 +
                                        fVar93 * local_10a8._12_4_ + fVar106 * local_1098[3]));
        fVar84 = *(float *)(ray + k * 4 + 0x30);
        fVar106 = *(float *)(ray + k * 4 + 0x80);
        valid.field_0.i[0] =
             -(uint)((fVar100 <= fVar106 * fVar94 && fVar84 * fVar94 < fVar100) && bVar13);
        valid.field_0.i[1] =
             -(uint)((fVar101 <= fVar106 * fVar98 && fVar84 * fVar98 < fVar101) && bVar14);
        valid.field_0.i[2] =
             -(uint)((fVar102 <= fVar106 * auVar97._8_4_ && fVar84 * auVar97._8_4_ < fVar102) &&
                    bVar12);
        valid.field_0.i[3] =
             -(uint)((fVar93 <= fVar106 * auVar97._12_4_ && fVar84 * auVar97._12_4_ < fVar93) &&
                    bVar11);
        uVar34 = movmskps(uVar34,(undefined1  [16])valid.field_0);
        pauVar20 = (undefined1 (*) [16])(ulong)uVar34;
        if (uVar34 != 0) {
          local_10b8 = local_1208;
          uStack_10b0 = CONCAT44(fVar77,fVar75);
          local_1188 = context->scene;
          auVar60 = rcpps(local_10a8,auVar97);
          fVar84 = auVar60._0_4_;
          fVar74 = auVar60._4_4_;
          fVar76 = auVar60._8_4_;
          fVar78 = auVar60._12_4_;
          fVar84 = (1.0 - fVar94 * fVar84) * fVar84 + fVar84;
          fVar74 = (1.0 - fVar98 * fVar74) * fVar74 + fVar74;
          fVar76 = (1.0 - auVar97._8_4_ * fVar76) * fVar76 + fVar76;
          fVar78 = (1.0 - auVar97._12_4_ * fVar78) * fVar78 + fVar78;
          fVar100 = fVar100 * fVar84;
          fVar101 = fVar101 * fVar74;
          fVar102 = fVar102 * fVar76;
          fVar93 = fVar93 * fVar78;
          local_10c8[0] = fVar100;
          local_10c8[1] = fVar101;
          local_10c8[2] = fVar102;
          local_10c8[3] = fVar93;
          local_10e8[0] = tNear.field_0.v[0] * fVar84;
          local_10e8[1] = tNear.field_0.v[1] * fVar74;
          local_10e8[2] = tNear.field_0.v[2] * fVar76;
          local_10e8[3] = tNear.field_0.v[3] * fVar78;
          local_10d8[0] = fVar84 * fVar108;
          local_10d8[1] = fVar74 * fVar110;
          local_10d8[2] = fVar76 * fVar112;
          local_10d8[3] = fVar78 * fVar114;
          auVar9._4_4_ = fVar101;
          auVar9._0_4_ = fVar100;
          auVar9._8_4_ = fVar102;
          auVar9._12_4_ = fVar93;
          auVar81 = blendvps(_DAT_01f45a30,auVar9,(undefined1  [16])valid.field_0);
          auVar72._4_4_ = auVar81._0_4_;
          auVar72._0_4_ = auVar81._4_4_;
          auVar72._8_4_ = auVar81._12_4_;
          auVar72._12_4_ = auVar81._8_4_;
          auVar60 = minps(auVar72,auVar81);
          auVar51._0_8_ = auVar60._8_8_;
          auVar51._8_4_ = auVar60._0_4_;
          auVar51._12_4_ = auVar60._4_4_;
          auVar60 = minps(auVar51,auVar60);
          uVar34 = -(uint)(auVar60._0_4_ == auVar81._0_4_);
          uVar45 = -(uint)(auVar60._4_4_ == auVar81._4_4_);
          uVar47 = -(uint)(auVar60._8_4_ == auVar81._8_4_);
          uVar49 = -(uint)(auVar60._12_4_ == auVar81._12_4_);
          auVar64._4_4_ = uVar45;
          auVar64._0_4_ = uVar34;
          auVar62._0_4_ = uVar34 & valid.field_0.i[0];
          auVar62._4_4_ = uVar45 & valid.field_0.i[1];
          auVar62._8_4_ = uVar47 & valid.field_0.i[2];
          auVar62._12_4_ = uVar49 & valid.field_0.i[3];
          iVar17 = movmskps((int)local_1188,auVar62);
          auVar63._8_4_ = 0xffffffff;
          auVar63._0_8_ = 0xffffffffffffffff;
          auVar63._12_4_ = 0xffffffff;
          if (iVar17 != 0) {
            auVar64._8_4_ = uVar47;
            auVar64._12_4_ = uVar49;
            auVar63 = auVar64;
          }
          lVar23 = lVar23 + uVar32;
          auVar41._0_4_ = valid.field_0.i[0] & auVar63._0_4_;
          auVar41._4_4_ = valid.field_0.i[1] & auVar63._4_4_;
          auVar41._8_4_ = valid.field_0.i[2] & auVar63._8_4_;
          auVar41._12_4_ = valid.field_0.i[3] & auVar63._12_4_;
          uVar18 = movmskps(iVar17,auVar41);
          uVar21 = CONCAT44((int)((ulong)local_1188 >> 0x20),uVar18);
          lVar22 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
            }
          }
LAB_006e51ad:
          uVar34 = *(uint *)(lVar23 + 0x90 + lVar22 * 4);
          pGVar7 = (local_1188->geometries).items[uVar34].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            valid.field_0.v[lVar22] = 0.0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar84 = local_10e8[lVar22];
              fVar106 = local_10d8[lVar22];
              *(float *)(ray + k * 4 + 0x80) = local_10c8[lVar22];
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_10b8 + lVar22 * 4);
              *(float *)(ray + k * 4 + 0xd0) = local_1098[lVar22 + -4];
              *(float *)(ray + k * 4 + 0xe0) = local_1098[lVar22];
              *(float *)(ray + k * 4 + 0xf0) = fVar84;
              *(float *)(ray + k * 4 + 0x100) = fVar106;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar23 + 0xa0 + lVar22 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar34;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              uVar34 = context->user->instPrimID[0];
              pauVar20 = (undefined1 (*) [16])(ulong)uVar34;
              *(uint *)(ray + k * 4 + 0x140) = uVar34;
              goto LAB_006e5020;
            }
            local_1088 = fVar100;
            fStack_1084 = fVar101;
            fStack_1080 = fVar102;
            fStack_107c = fVar93;
            h.u.field_0.v[0] = local_10e8[lVar22];
            h.v.field_0.v[0] = local_10d8[lVar22];
            uVar18 = *(undefined4 *)((long)&local_10b8 + lVar22 * 4);
            fVar84 = local_1098[lVar22 + -4];
            h.geomID.field_0.i[1] = uVar34;
            h.geomID.field_0.i[0] = uVar34;
            h.geomID.field_0.i[2] = uVar34;
            h.geomID.field_0.i[3] = uVar34;
            h.primID.field_0.i[0] = *(uint *)(lVar23 + 0xa0 + lVar22 * 4);
            h.Ng.field_0._4_4_ = uVar18;
            h.Ng.field_0._0_4_ = uVar18;
            h.Ng.field_0._8_4_ = uVar18;
            h.Ng.field_0._12_4_ = uVar18;
            h.Ng.field_0._20_4_ = (int)fVar84;
            h.Ng.field_0._16_4_ = (int)fVar84;
            h.Ng.field_0._24_4_ = (int)fVar84;
            h.Ng.field_0._28_4_ = (int)fVar84;
            fVar84 = local_1098[lVar22];
            h.Ng.field_0._36_4_ = (int)fVar84;
            h.Ng.field_0._32_4_ = (int)fVar84;
            h.Ng.field_0._40_4_ = (int)fVar84;
            h.Ng.field_0._44_4_ = (int)fVar84;
            h.u.field_0.v[1] = h.u.field_0.v[0];
            h.u.field_0.v[2] = h.u.field_0.v[0];
            h.u.field_0.v[3] = h.u.field_0.v[0];
            h.v.field_0.v[1] = h.v.field_0.v[0];
            h.v.field_0.v[2] = h.v.field_0.v[0];
            h.v.field_0.v[3] = h.v.field_0.v[0];
            h.primID.field_0.i[1] = h.primID.field_0.i[0];
            h.primID.field_0.i[2] = h.primID.field_0.i[0];
            h.primID.field_0.i[3] = h.primID.field_0.i[0];
            h.instID[0].field_0.i[0] = context->user->instID[0];
            h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
            h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
            h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
            h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
            *(float *)(ray + k * 4 + 0x80) = local_10c8[lVar22];
            local_11b8 = *local_1180;
            args.valid = (int *)local_11b8;
            args.geometryUserPtr = pGVar7->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&h;
            args.N = 4;
            local_11a0 = lVar27;
            local_1198 = lVar26;
            local_1190 = uVar28;
            args.ray = (RTCRayN *)ray;
            if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar7->intersectionFilterN)(&args);
            }
            if (local_11b8 == (undefined1  [16])0x0) {
              auVar52._8_4_ = 0xffffffff;
              auVar52._0_8_ = 0xffffffffffffffff;
              auVar52._12_4_ = 0xffffffff;
              auVar52 = auVar52 ^ _DAT_01f46b70;
            }
            else {
              p_Var8 = context->args->filter;
              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var8)(&args);
              }
              auVar42._0_4_ = -(uint)(local_11b8._0_4_ == 0);
              auVar42._4_4_ = -(uint)(local_11b8._4_4_ == 0);
              auVar42._8_4_ = -(uint)(local_11b8._8_4_ == 0);
              auVar42._12_4_ = -(uint)(local_11b8._12_4_ == 0);
              auVar52 = auVar42 ^ _DAT_01f46b70;
              if (local_11b8 != (undefined1  [16])0x0) {
                auVar60 = blendvps(*(undefined1 (*) [16])args.hit,
                                   *(undefined1 (*) [16])(args.ray + 0xc0),auVar42);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar60;
                auVar60 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                   *(undefined1 (*) [16])(args.ray + 0xd0),auVar42);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar60;
                auVar60 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                   *(undefined1 (*) [16])(args.ray + 0xe0),auVar42);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar60;
                auVar60 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                   *(undefined1 (*) [16])(args.ray + 0xf0),auVar42);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar60;
                auVar60 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                   *(undefined1 (*) [16])(args.ray + 0x100),auVar42);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar60;
                auVar60 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                   *(undefined1 (*) [16])(args.ray + 0x110),auVar42);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar60;
                auVar60 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                   *(undefined1 (*) [16])(args.ray + 0x120),auVar42);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar60;
                auVar60 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                   *(undefined1 (*) [16])(args.ray + 0x130),auVar42);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar60;
                auVar60 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                   *(undefined1 (*) [16])(args.ray + 0x140),auVar42);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar60;
              }
            }
            if ((_DAT_01f46b40 & auVar52) == (undefined1  [16])0x0) {
              *(float *)(ray + k * 4 + 0x80) = fVar106;
            }
            else {
              fVar106 = *(float *)(ray + k * 4 + 0x80);
            }
            valid.field_0.v[lVar22] = 0.0;
            valid.field_0.i[0] = -(uint)(local_1088 <= fVar106) & valid.field_0.i[0];
            valid.field_0.i[1] = -(uint)(fStack_1084 <= fVar106) & valid.field_0.i[1];
            valid.field_0.i[2] = -(uint)(fStack_1080 <= fVar106) & valid.field_0.i[2];
            valid.field_0.i[3] = -(uint)(fStack_107c <= fVar106) & valid.field_0.i[3];
            lVar26 = local_1198;
            lVar27 = local_11a0;
            uVar28 = local_1190;
            fVar100 = local_1088;
            fVar101 = fStack_1084;
            fVar102 = fStack_1080;
            fVar93 = fStack_107c;
          }
          uVar18 = (undefined4)((ulong)lVar22 >> 0x20);
          iVar17 = movmskps((int)lVar22,(undefined1  [16])valid.field_0);
          pauVar20 = (undefined1 (*) [16])CONCAT44(uVar18,iVar17);
          if (iVar17 == 0) goto LAB_006e5020;
          auVar10._4_4_ = fVar101;
          auVar10._0_4_ = fVar100;
          auVar10._8_4_ = fVar102;
          auVar10._12_4_ = fVar93;
          auVar81 = blendvps(_DAT_01f45a30,auVar10,(undefined1  [16])valid.field_0);
          auVar73._4_4_ = auVar81._0_4_;
          auVar73._0_4_ = auVar81._4_4_;
          auVar73._8_4_ = auVar81._12_4_;
          auVar73._12_4_ = auVar81._8_4_;
          auVar60 = minps(auVar73,auVar81);
          auVar53._0_8_ = auVar60._8_8_;
          auVar53._8_4_ = auVar60._0_4_;
          auVar53._12_4_ = auVar60._4_4_;
          auVar60 = minps(auVar53,auVar60);
          auVar54._0_8_ =
               CONCAT44(-(uint)(auVar60._4_4_ == auVar81._4_4_) & valid.field_0._4_4_,
                        -(uint)(auVar60._0_4_ == auVar81._0_4_) & valid.field_0._0_4_);
          auVar54._8_4_ = -(uint)(auVar60._8_4_ == auVar81._8_4_) & valid.field_0._8_4_;
          auVar54._12_4_ = -(uint)(auVar60._12_4_ == auVar81._12_4_) & valid.field_0._12_4_;
          iVar17 = movmskps(iVar17,auVar54);
          aVar43 = valid.field_0;
          if (iVar17 != 0) {
            aVar43.i[2] = auVar54._8_4_;
            aVar43._0_8_ = auVar54._0_8_;
            aVar43.i[3] = auVar54._12_4_;
          }
          uVar19 = movmskps(iVar17,(undefined1  [16])aVar43);
          uVar21 = CONCAT44(uVar18,uVar19);
          lVar22 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
            }
          }
          goto LAB_006e51ad;
        }
      }
LAB_006e5020:
      fVar84 = local_1018;
      fVar110 = fStack_1014;
      fVar112 = fStack_1010;
      fVar114 = fStack_100c;
      fVar106 = local_1028;
      fVar100 = fStack_1024;
      fVar101 = fStack_1020;
      fVar102 = fStack_101c;
      fVar94 = local_1038;
      fVar74 = fStack_1034;
      fVar76 = fStack_1030;
      fVar78 = fStack_102c;
      fVar98 = local_1048;
      fVar115 = fStack_1044;
      fVar116 = fStack_1040;
      fVar117 = fStack_103c;
      fVar93 = local_1058;
      fVar119 = fStack_1054;
      fVar121 = fStack_1050;
      fVar123 = fStack_104c;
      fVar108 = local_1068;
      fVar125 = fStack_1064;
      fVar126 = fStack_1060;
      fVar127 = fStack_105c;
      iVar17 = local_1078;
      iVar129 = iStack_1074;
      iVar131 = iStack_1070;
      iVar133 = iStack_106c;
    }
    iVar50 = *(int *)(ray + k * 4 + 0x80);
    iVar55 = iVar50;
    iVar56 = iVar50;
    iVar57 = iVar50;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }